

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O0

void printShifter(MCInst *MI,uint OpNum,SStream *O)

{
  AArch64_AM_ShiftExtendType AVar1;
  uint uVar2;
  uint uVar3;
  MCOperand *op;
  int64_t iVar4;
  char *pcVar5;
  undefined4 local_28;
  arm64_shifter shifter;
  uint Val;
  SStream *O_local;
  uint OpNum_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNum);
  iVar4 = MCOperand_getImm(op);
  uVar3 = (uint)iVar4;
  AVar1 = AArch64_AM_getShiftType(uVar3);
  if ((AVar1 != AArch64_AM_LSL) || (uVar2 = AArch64_AM_getShiftValue(uVar3), uVar2 != 0)) {
    AVar1 = AArch64_AM_getShiftType(uVar3);
    pcVar5 = AArch64_AM_getShiftExtendName(AVar1);
    SStream_concat(O,", %s ",pcVar5);
    uVar2 = AArch64_AM_getShiftValue(uVar3);
    printInt32BangDec(O,uVar2);
    if (MI->csh->detail != CS_OPT_OFF) {
      AVar1 = AArch64_AM_getShiftType(uVar3);
      switch(AVar1) {
      default:
        local_28 = 1;
        break;
      case AArch64_AM_LSR:
        local_28 = 3;
        break;
      case AArch64_AM_ASR:
        local_28 = 4;
        break;
      case AArch64_AM_ROR:
        local_28 = 5;
        break;
      case AArch64_AM_MSL:
        local_28 = 2;
      }
      *(undefined4 *)
       (MI->flat_insn->detail->groups +
       (long)(int)((MI->flat_insn->detail->field_6).x86.opcode[2] - 1) * 0x30 + 0x22) = local_28;
      uVar3 = AArch64_AM_getShiftValue(uVar3);
      *(uint *)(MI->flat_insn->detail->groups +
               (long)(int)((MI->flat_insn->detail->field_6).x86.opcode[2] - 1) * 0x30 + 0x26) =
           uVar3;
    }
  }
  return;
}

Assistant:

static void printShifter(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned Val = (unsigned)MCOperand_getImm(MCInst_getOperand(MI, OpNum));

	// LSL #0 should not be printed.
	if (AArch64_AM_getShiftType(Val) == AArch64_AM_LSL &&
			AArch64_AM_getShiftValue(Val) == 0)
		return;

	SStream_concat(O, ", %s ", AArch64_AM_getShiftExtendName(AArch64_AM_getShiftType(Val)));
	printInt32BangDec(O, AArch64_AM_getShiftValue(Val));
	if (MI->csh->detail) {
		arm64_shifter shifter = ARM64_SFT_INVALID;
		switch(AArch64_AM_getShiftType(Val)) {
			default:	// never reach
			case AArch64_AM_LSL:
				shifter = ARM64_SFT_LSL;
				break;
			case AArch64_AM_LSR:
				shifter = ARM64_SFT_LSR;
				break;
			case AArch64_AM_ASR:
				shifter = ARM64_SFT_ASR;
				break;
			case AArch64_AM_ROR:
				shifter = ARM64_SFT_ROR;
				break;
			case AArch64_AM_MSL:
				shifter = ARM64_SFT_MSL;
				break;
		}

		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.type = shifter;
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.value = AArch64_AM_getShiftValue(Val);
	}
}